

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vitals.c
# Opt level: O0

void mmk_init_vital_functions(plt_ctx ctx)

{
  char *pcVar1;
  char *pcVar2;
  plt_ctx ctx_local;
  
  mmk_vfprintf_ = (_func_void_FILE_ptr_char_ptr___va_list_tag_ptr *)plt_get_real_fn(ctx,"vfprintf");
  mmk_abort_ = (_func_void *)plt_get_real_fn(ctx,"abort");
  if ((mmk_abort_ == (_func_void *)0x0) ||
     (mmk_vfprintf_ == (_func_void_FILE_ptr_char_ptr___va_list_tag_ptr *)0x0)) {
    pcVar2 = "\'abort\'";
    if (mmk_abort_ != (_func_void *)0x0) {
      pcVar2 = "";
    }
    pcVar1 = "\'vfprintf\'";
    if (mmk_vfprintf_ != (_func_void_FILE_ptr_char_ptr___va_list_tag_ptr *)0x0) {
      pcVar1 = "";
    }
    fprintf(_stderr,
            "mimick: Initialization error: could not find definitions for vital function(s): %s %s\n"
            ,pcVar2,pcVar1);
    abort();
  }
  mmk_malloc_ = (_func_void_ptr_size_t *)plt_get_real_fn(ctx,"malloc");
  if (mmk_malloc_ == (_func_void_ptr_size_t *)0x0) {
    mmk_panic(
             "mimick: Initialization error: could not find definition for vital function \'malloc\'.\n"
             );
  }
  mmk_realloc_ = (_func_void_ptr_void_ptr_size_t *)plt_get_real_fn(ctx,"realloc");
  if (mmk_realloc_ == (_func_void_ptr_void_ptr_size_t *)0x0) {
    mmk_panic(
             "mimick: Initialization error: could not find definition for vital function \'realloc\'.\n"
             );
  }
  mmk_free_ = (_func_void_void_ptr *)plt_get_real_fn(ctx,"free");
  if (mmk_free_ == (_func_void_void_ptr *)0x0) {
    mmk_panic(
             "mimick: Initialization error: could not find definition for vital function \'free\'.\n"
             );
  }
  mmk_mprotect_ = (_func_int_void_ptr_size_t_int *)plt_get_real_fn(ctx,"mprotect");
  if (mmk_mprotect_ == (_func_int_void_ptr_size_t_int *)0x0) {
    mmk_panic(
             "mimick: Initialization error: could not find definition for vital function \'mprotect\'.\n"
             );
  }
  return;
}

Assistant:

void mmk_init_vital_functions(plt_ctx ctx)
{
    mmk_vfprintf_ = (void *) plt_get_real_fn(ctx, "vfprintf");
    mmk_abort_    = (void *) plt_get_real_fn(ctx, "abort");

#ifdef HAVE___STDIO_COMMON_VFPRINTF
    /* Windows doesn't always dynlink to msvcstr.dll (when the universal CRT
       is used), so we don't have the definition for vfprintf since ucrt
       may define it as an inline function that calls
       __stdio_common_vfprintf. */
    if (!mmk_vfprintf_) {
        mmk___stdio_common_vfprintf_ = (void *)
                plt_get_real_fn(ctx, "__stdio_common_vfprintf");
        if (mmk___stdio_common_vfprintf_)
            mmk_vfprintf_ = win32_vfprintf_fallback;
    }
#endif

    /* Don't use mmk_panic yet, since it depends on both mmk_abort and
       mmk_vfprintf. */
    if (!mmk_abort_ || !mmk_vfprintf_) {
        fprintf(stderr, "mimick: Initialization error: could not find "
                "definitions for vital function(s): %s %s\n",
                mmk_abort_ ? "" : "'abort'",
                mmk_vfprintf_ ? "" : "'vfprintf'");
        abort();
    }

    INIT_VITAL_FUNC(malloc);
    INIT_VITAL_FUNC(realloc);
    INIT_VITAL_FUNC(free);
#if defined(MMK_EXE_FMT_ELF) || defined(MMK_EXE_FMT_MACH_O)
    INIT_VITAL_FUNC(mprotect);
#endif
}